

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

token * parse_do_statement(dmr_C *C,token *token,statement *stmt)

{
  token *ptVar1;
  expression *local_38;
  expression *expr;
  statement *iterator;
  
  start_iterator(C,stmt);
  ptVar1 = statement(C,token->next,(statement **)&expr);
  if (((SUB84(ptVar1->pos,0) & 0x3f) == 2) &&
     ((ident *)(ptVar1->field_2).number == C->S->while_ident)) {
    ptVar1 = ptVar1->next;
  }
  else {
    dmrC_sparse_error(C,ptVar1->pos,"expected \'while\' after \'do\'");
  }
  ptVar1 = dmrC_parens_expression(C,ptVar1,&local_38,"after \'do-while\'");
  (stmt->field_2).field_8.iterator_post_condition = local_38;
  (stmt->field_2).field_8.iterator_statement = (statement *)expr;
  dmrC_end_symbol_scope(C);
  if (((expr != (expression *)0x0) && (*(int *)expr != 3)) && (C->Wdo_while != 0)) {
    dmrC_warning(C,*(position *)&expr->op,"do-while statement is not a compound statement");
  }
  ptVar1 = dmrC_expect_token(C,ptVar1,0x3b,"after statement");
  return ptVar1;
}

Assistant:

static struct token *parse_do_statement(struct dmr_C *C, struct token *token, struct statement *stmt)
{
	struct expression *expr;
	struct statement *iterator;

	start_iterator(C, stmt);
	token = statement(C, token->next, &iterator);
	if (dmrC_token_type(token) == TOKEN_IDENT && token->ident == C->S->while_ident)
		token = token->next;
	else
		dmrC_sparse_error(C, token->pos, "expected 'while' after 'do'");
	token = dmrC_parens_expression(C, token, &expr, "after 'do-while'");

	stmt->iterator_post_condition = expr;
	stmt->iterator_statement = iterator;
	end_iterator(C, stmt);

	if (iterator && iterator->type != STMT_COMPOUND && C->Wdo_while)
		dmrC_warning(C, iterator->pos, "do-while statement is not a compound statement");

	return dmrC_expect_token(C, token, ';', "after statement");
}